

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::SetItemOnTaggedNumber
               (Var receiver,RecyclableObject *object,uint32 index,Var newValue,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *function;
  JavascriptProxy *this;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  RecyclableObject *object_local;
  PropertyOperationFlags local_4c;
  Var local_48;
  DescriptorFlags local_3c;
  Var pvStack_38;
  DescriptorFlags flags;
  Var setterValueOrProxy;
  
  propertyRecord = (PropertyRecord *)object;
  object_local = (RecyclableObject *)newValue;
  local_48 = receiver;
  bVar2 = TaggedNumber::Is(receiver);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xa0d,"(TaggedNumber::Is(receiver))","TaggedNumber::Is(receiver)");
    if (!bVar2) goto LAB_0099a6ba;
    *puVar4 = 0;
  }
  if (((requestContext->optimizationOverrides).sideEffects & SideEffects_Accessor) !=
      SideEffects_None) {
    pvStack_38 = (Var)0x0;
    local_3c = None;
    if (object == (RecyclableObject *)0x0) {
      GetPropertyObject(local_48,requestContext,(RecyclableObject **)&propertyRecord);
      object = (RecyclableObject *)propertyRecord;
    }
    BVar3 = CheckPrototypesForAccessorOrNonWritableItem
                      (object,index,&stack0xffffffffffffffc8,&local_3c,requestContext,0);
    if (BVar3 != 0) {
      if ((local_3c & Accessor) == None) {
        if ((local_3c & Proxy) != None) {
          local_4c = propertyOperationFlags;
          bVar2 = VarIs<Js::JavascriptProxy>(pvStack_38);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0xa28,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                        "VarIs<JavascriptProxy>(setterValueOrProxy)");
            if (!bVar2) goto LAB_0099a6ba;
            *puVar4 = 0;
          }
          this = VarTo<Js::JavascriptProxy>(pvStack_38);
          local_68 = (PropertyRecord *)0x0;
          JavascriptProxy::PropertyIdFromInt(this,index,&local_68);
          BVar3 = JavascriptProxy::SetPropertyTrap
                            (this,local_48,SetItemOnTaggedNumberKind,local_68->pid,object_local,
                             requestContext,local_4c,0);
          return BVar3;
        }
        if ((local_3c & WritableData) != Data) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0xa30,
                                      "((flags & Data) == Data && (flags & Writable) == None)",
                                      "(flags & Data) == Data && (flags & Writable) == None");
          if (!bVar2) {
LAB_0099a6ba:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
      }
      else {
        bVar2 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                          (propertyOperationFlags,pvStack_38,requestContext);
        if (bVar2) {
          return 1;
        }
        if (pvStack_38 != (Var)0x0) {
          function = VarTo<Js::RecyclableObject>(pvStack_38);
          CallSetter(function,local_48,object_local,requestContext);
          return 1;
        }
      }
    }
  }
  JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetItemOnTaggedNumber(Var receiver, RecyclableObject* object, uint32 index, Var newValue, ScriptContext* requestContext,
        PropertyOperationFlags propertyOperationFlags)
    {
        Assert(TaggedNumber::Is(receiver));

        if (requestContext->optimizationOverrides.GetSideEffects() & SideEffects_Accessor)
        {
            Var setterValueOrProxy = nullptr;
            DescriptorFlags flags = None;
            if (object == nullptr)
            {
                GetPropertyObject(receiver, requestContext, &object);
            }
            if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(object, index, &setterValueOrProxy, &flags, requestContext))
            {
                if ((flags & Accessor) == Accessor)
                {
                    if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext))
                    {
                        return TRUE;
                    }
                    if (setterValueOrProxy)
                    {
                        RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                        JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                        return TRUE;
                    }
                }
                else if ((flags & Proxy) == Proxy)
                {
                    Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                    JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                    const PropertyRecord* propertyRecord = nullptr;
                    proxy->PropertyIdFromInt(index, &propertyRecord);
                    return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetItemOnTaggedNumberKind, propertyRecord->GetPropertyId(), newValue, requestContext, propertyOperationFlags);
                }
                else
                {
                    Assert((flags & Data) == Data && (flags & Writable) == None);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                }
            }
        }

        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
        return FALSE;
    }